

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_draw_sb_mode_line(void)

{
  int *piVar1;
  size_t *psVar2;
  int left;
  osgen_txtwin_t *win;
  int color;
  int top;
  
  win = S_sbmode_win;
  if (S_sbmode_win != (osgen_txtwin_t *)0x0) {
    color = ossgetcolor((int)(S_sbmode_win->base).fillcolor,(int)(S_sbmode_win->base).txtfg,0,1);
    left = (win->base).winx;
    top = (win->base).winy + -1;
    ossclr(top,left,top,left + (int)(win->base).wid + -1,color);
    piVar1 = &(win->base).winy;
    *piVar1 = *piVar1 + -1;
    psVar2 = &(win->base).ht;
    *psVar2 = *psVar2 + 1;
    osgen_disp_trunc(&win->base,0,0,color,
                     "Review Mode - Keys: Up/Down/PageUp/PageDown - F1/Esc to exit");
    piVar1 = &(win->base).winy;
    *piVar1 = *piVar1 + 1;
    psVar2 = &(win->base).ht;
    *psVar2 = *psVar2 - 1;
  }
  return;
}

Assistant:

static void osgen_draw_sb_mode_line(void)
{
    osgen_txtwin_t *win;
    int oss_color;

    /* get the current scrollback window */
    win = S_sbmode_win;

    /* there's nothing to do if there's no scrollback window */
    if (win == 0)
        return;

    /* get the color - use the reverse of the window's current color scheme */
    oss_color = ossgetcolor(win->base.fillcolor, win->base.txtfg, 0,
                            OSGEN_COLOR_TRANSPARENT);

    /* clear the area of the mode line */
    ossclr(win->base.winy - 1, win->base.winx,
           win->base.winy - 1, win->base.winx + win->base.wid - 1, oss_color);

    /* momentarily bring the mode line back into the window's area */
    win->base.winy -= 1;
    win->base.ht += 1;

    /* draw the mode line text */
    osgen_disp_trunc(&win->base, 0, 0, oss_color, OS_SBSTAT);

    /* undo our temporary adjustment of the window size */
    win->base.winy += 1;
    win->base.ht -= 1;
}